

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createMatrixConstructor
          (Builder *this,Decoration precision,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sources,Id resultTypeId)

{
  pointer __s1;
  pointer ppIVar1;
  pointer __s2;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [8];
  Id IVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Id IVar10;
  Instruction *pIVar11;
  pointer *ppuVar12;
  uint *puVar13;
  long lVar14;
  size_t __n;
  ulong uVar15;
  ulong uVar16;
  Id IVar17;
  pointer *__args;
  uint comp;
  bool bVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  Id column;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matrixColumns;
  Id colv;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Id ids [4] [4];
  uint local_f4;
  uint local_f0;
  uint local_ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_e8;
  Id local_e0;
  Decoration local_dc;
  undefined1 local_d8 [8];
  iterator iStack_d0;
  uint *local_c8;
  Id local_bc;
  undefined1 local_b8 [8];
  iterator iStack_b0;
  uint *local_a8;
  ulong local_98;
  Id local_8c;
  ulong local_88;
  ulong local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78 [3];
  
  IVar6 = getScalarTypeId(this,resultTypeId);
  local_f0 = getTypeNumColumns(this,resultTypeId);
  local_e0 = resultTypeId;
  local_ec = getTypeNumRows(this,resultTypeId);
  local_98 = CONCAT44(local_98._4_4_,IVar6);
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((**(byte **)&(ppIVar1[IVar6]->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data & 1) != 0) {
    __assert_fail("!idOperand[op]",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
  }
  iVar19 = **(int **)&(ppIVar1[IVar6]->operands).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data;
  puVar13 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (ppIVar1[*puVar13] == (Instruction *)0x0) {
    pIVar11 = *ppIVar1;
    uVar7 = 0;
  }
  else {
    uVar7 = ppIVar1[*puVar13]->typeId;
    pIVar11 = ppIVar1[uVar7];
  }
  local_e8 = sources;
  if (pIVar11->opCode == OpTypeMatrix) {
    uVar7 = getTypeNumColumns(this,uVar7);
    puVar13 = (local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (local_f0 <= uVar7) {
      pIVar11 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[*puVar13];
      if (pIVar11 == (Instruction *)0x0) {
        IVar6 = 0;
      }
      else {
        IVar6 = pIVar11->typeId;
      }
      uVar7 = getTypeNumRows(this,IVar6);
      puVar13 = (local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (local_ec <= uVar7) {
        uVar7 = *puVar13;
        IVar6 = 0;
        IVar10 = getContainedTypeId(this,local_e0,0);
        local_e8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(local_e8._4_4_,IVar10);
        pIVar11 = (this->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7];
        if (pIVar11 != (Instruction *)0x0) {
          IVar6 = pIVar11->typeId;
        }
        uVar20 = 0;
        IVar6 = getContainedTypeId(this,IVar6,0);
        local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        auVar3._12_4_ = 0;
        auVar3._0_12_ = stack0xffffffffffffff2c;
        _local_d8 = auVar3 << 0x20;
        if (local_ec != 0) {
          do {
            if (local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_78,
                         (iterator)
                         local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(uint *)local_d8);
            }
            else {
              *local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar20;
              local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar20 = local_d8._0_4_ + 1;
            local_d8._0_4_ = uVar20;
          } while (uVar20 < local_ec);
        }
        _local_d8 = (undefined1  [16])0x0;
        local_c8 = (uint *)0x0;
        local_f4 = 0;
        IVar10 = (Id)local_e8;
        if (local_f0 != 0) {
          do {
            _local_b8 = (undefined1  [16])0x0;
            local_a8 = (uint *)0x0;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,(iterator)0x0,
                       &local_f4);
            local_bc = createCompositeExtract
                                 (this,uVar7,IVar6,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
            if ((precision != DecorationMax) && (local_bc != 0)) {
              addDecoration(this,local_bc,precision,-1);
            }
            pIVar11 = (this->module).idToInstruction.
                      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar7];
            if (pIVar11 == (Instruction *)0x0) {
              IVar17 = 0;
            }
            else {
              IVar17 = pIVar11->typeId;
            }
            uVar20 = getTypeNumRows(this,IVar17);
            if (local_ec == uVar20) {
              IVar17 = local_bc;
              if (iStack_d0._M_current == local_c8) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_d8,iStack_d0,
                           &local_bc);
              }
              else {
LAB_003da6e7:
                *iStack_d0._M_current = IVar17;
                iStack_d0._M_current = iStack_d0._M_current + 1;
              }
            }
            else {
              local_8c = createRvalueSwizzle(this,precision,IVar10,local_bc,local_78);
              IVar17 = local_8c;
              if (iStack_d0._M_current != local_c8) goto LAB_003da6e7;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,iStack_d0,
                         &local_8c);
            }
            if (local_b8 != (undefined1  [8])0x0) {
              operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
            }
            local_f4 = local_f4 + 1;
          } while (local_f4 < local_f0);
        }
        IVar6 = createCompositeConstruct
                          (this,local_e0,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
        if (IVar6 != 0 && precision != DecorationMax) {
          addDecoration(this,IVar6,precision,-1);
        }
        if (local_d8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
        }
        auVar5 = (undefined1  [8])
                 local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        puVar13 = local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        goto joined_r0x003daa30;
      }
    }
  }
  local_80 = (ulong)local_f0;
  if ((long)(local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar13 >> 2 == local_80) {
    ppIVar1 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar1[*puVar13] == (Instruction *)0x0) {
      pIVar11 = *ppIVar1;
      uVar7 = 0;
    }
    else {
      uVar7 = ppIVar1[*puVar13]->typeId;
      pIVar11 = ppIVar1[uVar7];
    }
    if ((pIVar11->opCode == OpTypeVector) &&
       (uVar7 = getNumTypeConstituents(this,uVar7), uVar7 == local_ec)) {
      __s2 = (local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
      __s1 = __s2 + 1;
      __n = (long)(local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)__s1;
      if ((__n == 0) || (iVar8 = bcmp(__s1,__s2,__n), iVar8 == 0)) {
        IVar6 = createCompositeConstruct(this,local_e0,local_e8);
        if (IVar6 == 0 || precision == DecorationMax) {
          return IVar6;
        }
        addDecoration(this,IVar6,precision,-1);
        return IVar6;
      }
    }
  }
  if (iVar19 == 0x40) {
    IVar6 = makeDoubleConstant(this,1.0,false);
    uVar7 = makeDoubleConstant(this,0.0,false);
  }
  else {
    IVar6 = makeFloatConstant(this,1.0,false);
    uVar7 = makeFloatConstant(this,0.0,false);
  }
  ppuVar12 = (pointer *)local_78;
  lVar14 = 0;
  do {
    iVar19 = (int)lVar14;
    iVar8 = (int)((ulong)lVar14 >> 0x20);
    uVar20 = -(uint)(iVar8 == 0 && iVar19 == 0);
    uVar21 = -(uint)(iVar19 == 1 && iVar8 == 0);
    uVar22 = -(uint)(iVar8 == 0 && iVar19 == 2);
    uVar23 = -(uint)(iVar19 == 3 && iVar8 == 0);
    *(uint *)ppuVar12 = ~uVar20 & uVar7 | IVar6 & uVar20;
    *(uint *)((long)ppuVar12 + 4) = ~uVar21 & uVar7 | IVar6 & uVar21;
    *(uint *)(ppuVar12 + 1) = ~uVar22 & uVar7 | IVar6 & uVar22;
    *(uint *)((long)ppuVar12 + 0xc) = ~uVar23 & uVar7 | IVar6 & uVar23;
    lVar14 = lVar14 + 1;
    ppuVar12 = ppuVar12 + 2;
  } while (lVar14 != 4);
  puVar13 = (local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar2 = (local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = *puVar13;
  ppIVar1 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar11 = ppIVar1[uVar7];
  local_dc = precision;
  if ((long)puVar2 - (long)puVar13 == 4) {
    if (pIVar11 == (Instruction *)0x0) {
      uVar16 = 0;
    }
    else {
      uVar16 = (ulong)pIVar11->typeId;
    }
    if (2 < ppIVar1[uVar16]->opCode - OpTypeBool) goto LAB_003da3c8;
    lVar14 = 0;
    do {
      *(uint *)((long)&local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar14) = uVar7;
      lVar14 = lVar14 + 0x14;
    } while (lVar14 != 0x50);
  }
  else {
LAB_003da3c8:
    if (pIVar11 == (Instruction *)0x0) {
      pIVar11 = *ppIVar1;
      uVar20 = 0;
    }
    else {
      uVar20 = pIVar11->typeId;
      pIVar11 = ppIVar1[uVar20];
    }
    if (pIVar11->opCode == OpTypeMatrix) {
      uVar20 = getTypeNumColumns(this,uVar20);
      if (local_f0 <= uVar20) {
        uVar20 = local_f0;
      }
      local_e8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(local_e8._4_4_,uVar20);
      pIVar11 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
      if (pIVar11 == (Instruction *)0x0) {
        IVar6 = 0;
      }
      else {
        IVar6 = pIVar11->typeId;
      }
      uVar20 = getTypeNumRows(this,IVar6);
      if (local_ec <= uVar20) {
        uVar20 = local_ec;
      }
      auVar4._12_4_ = 0;
      auVar4._0_12_ = stack0xffffffffffffff4c;
      _local_b8 = auVar4 << 0x20;
      if ((Id)local_e8 != 0) {
        do {
          _local_d8 = (undefined1  [16])0x0;
          local_c8 = (uint *)0x0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_d8,(iterator)0x0,
                     (uint *)local_b8);
          local_f4 = 0;
          if (uVar20 != 0) {
            do {
              if (iStack_d0._M_current == local_c8) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_d8,iStack_d0,
                           &local_f4);
              }
              else {
                *iStack_d0._M_current = local_f4;
                iStack_d0._M_current = iStack_d0._M_current + 1;
              }
              IVar6 = createCompositeExtract
                                (this,uVar7,(Id)local_98,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
              iStack_d0._M_current = iStack_d0._M_current + -1;
              *(Id *)((long)&local_78[0].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start +
                     (ulong)local_f4 * 4 + (ulong)(uint)local_b8._0_4_ * 0x10) = IVar6;
              if (IVar6 != 0 && precision != DecorationMax) {
                addDecoration(this,IVar6,precision,-1);
              }
              local_f4 = local_f4 + 1;
            } while (local_f4 < uVar20);
          }
          if (local_d8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_d8,(long)local_c8 - (long)local_d8);
          }
          uVar21 = local_b8._0_4_ + 1;
          local_b8._0_4_ = uVar21;
        } while (uVar21 < (Id)local_e8);
      }
    }
    else if (local_f0 != 0 && puVar2 != puVar13) {
      uVar16 = 0;
      uVar7 = 0;
      uVar20 = 0;
      do {
        uVar21 = puVar13[uVar16];
        uVar22 = 0;
        local_88 = uVar16;
        do {
          pIVar11 = (this->module).idToInstruction.
                    super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar16]];
          if (pIVar11 == (Instruction *)0x0) {
            IVar6 = 0;
          }
          else {
            IVar6 = pIVar11->typeId;
          }
          uVar9 = getNumTypeConstituents(this,IVar6);
          uVar23 = uVar7;
          if (uVar9 <= uVar22) break;
          pIVar11 = (this->module).idToInstruction.
                    super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar16]];
          if (pIVar11 == (Instruction *)0x0) {
            IVar6 = 0;
          }
          else {
            IVar6 = pIVar11->typeId;
          }
          uVar23 = getNumTypeConstituents(this,IVar6);
          if (1 < uVar23) {
            uVar21 = createCompositeExtract
                               (this,(local_e8->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar16],(Id)local_98
                                ,uVar22);
            if ((local_dc != DecorationMax) && (uVar21 != 0)) {
              addDecoration(this,uVar21,local_dc,-1);
            }
          }
          uVar15 = (ulong)uVar20;
          uVar20 = uVar20 + 1;
          *(uint *)((long)&local_78[0].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar15 * 4 + (ulong)uVar7 * 0x10) =
               uVar21;
          bVar18 = uVar20 == local_ec;
          if (bVar18) {
            uVar20 = 0;
          }
          uVar7 = uVar7 + bVar18;
          uVar22 = uVar22 + 1;
          uVar23 = local_f0;
        } while (uVar7 != local_f0);
        uVar7 = uVar23;
        uVar16 = (ulong)((int)local_88 + 1);
        puVar13 = (local_e8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      } while ((uVar16 < (ulong)((long)(local_e8->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar13
                                >> 2)) && (uVar7 < local_f0));
    }
  }
  IVar6 = getContainedTypeId(this,local_e0,0);
  local_e8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(local_e8._4_4_,IVar6);
  _local_d8 = (undefined1  [16])0x0;
  local_c8 = (uint *)0x0;
  if (local_f0 != 0) {
    local_98 = (ulong)local_ec;
    ppuVar12 = (pointer *)local_78;
    uVar16 = 0;
    do {
      _local_b8 = (undefined1  [16])0x0;
      local_a8 = (uint *)0x0;
      uVar15 = local_98;
      __args = ppuVar12;
      if (local_ec != 0) {
        do {
          if (iStack_b0._M_current == local_a8) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_b8,iStack_b0,
                       (uint *)__args);
          }
          else {
            *iStack_b0._M_current = *(uint *)__args;
            iStack_b0._M_current = iStack_b0._M_current + 1;
          }
          __args = (pointer *)((long)__args + 4);
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      bVar18 = local_dc != DecorationMax;
      local_f4 = createCompositeConstruct
                           (this,(Id)local_e8,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
      if (local_f4 != 0 && bVar18) {
        addDecoration(this,local_f4,local_dc,-1);
      }
      if (iStack_d0._M_current == local_c8) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_d8,iStack_d0,&local_f4
                  );
      }
      else {
        *iStack_d0._M_current = local_f4;
        iStack_d0._M_current = iStack_d0._M_current + 1;
      }
      if (local_b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_b8,(long)local_a8 - (long)local_b8);
      }
      uVar16 = uVar16 + 1;
      ppuVar12 = ppuVar12 + 2;
    } while (uVar16 != local_80);
  }
  IVar6 = createCompositeConstruct
                    (this,local_e0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
  if (IVar6 != 0 && local_dc != DecorationMax) {
    addDecoration(this,IVar6,local_dc,-1);
  }
  auVar5 = local_d8;
  puVar13 = local_c8;
joined_r0x003daa30:
  if (auVar5 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar5,(long)puVar13 - (long)auVar5);
  }
  return IVar6;
}

Assistant:

Id Builder::createMatrixConstructor(Decoration precision, const std::vector<Id>& sources, Id resultTypeId)
{
    Id componentTypeId = getScalarTypeId(resultTypeId);
    unsigned int numCols = getTypeNumColumns(resultTypeId);
    unsigned int numRows = getTypeNumRows(resultTypeId);

    Instruction* instr = module.getInstruction(componentTypeId);
    const unsigned bitCount = instr->getImmediateOperand(0);

    // Optimize matrix constructed from a bigger matrix
    if (isMatrix(sources[0]) && getNumColumns(sources[0]) >= numCols && getNumRows(sources[0]) >= numRows) {
        // To truncate the matrix to a smaller number of rows/columns, we need to:
        // 1. For each column, extract the column and truncate it to the required size using shuffle
        // 2. Assemble the resulting matrix from all columns
        Id matrix = sources[0];
        Id columnTypeId = getContainedTypeId(resultTypeId);
        Id sourceColumnTypeId = getContainedTypeId(getTypeId(matrix));

        std::vector<unsigned> channels;
        for (unsigned int row = 0; row < numRows; ++row)
            channels.push_back(row);

        std::vector<Id> matrixColumns;
        for (unsigned int col = 0; col < numCols; ++col) {
            std::vector<unsigned> indexes;
            indexes.push_back(col);
            Id colv = createCompositeExtract(matrix, sourceColumnTypeId, indexes);
            setPrecision(colv, precision);

            if (numRows != getNumRows(matrix)) {
                matrixColumns.push_back(createRvalueSwizzle(precision, columnTypeId, colv, channels));
            } else {
                matrixColumns.push_back(colv);
            }
        }

        return setPrecision(createCompositeConstruct(resultTypeId, matrixColumns), precision);
    }

    // Detect a matrix being constructed from a repeated vector of the correct size.
    // Create the composite directly from it.
    if (sources.size() == numCols && isVector(sources[0]) && getNumComponents(sources[0]) == numRows &&
        std::equal(sources.begin() + 1, sources.end(), sources.begin())) {
        return setPrecision(createCompositeConstruct(resultTypeId, sources), precision);
    }

    // Otherwise, will use a two step process
    // 1. make a compile-time 2D array of values
    // 2. construct a matrix from that array

    // Step 1.

    // initialize the array to the identity matrix
    Id ids[maxMatrixSize][maxMatrixSize];
    Id  one = (bitCount == 64 ? makeDoubleConstant(1.0) : makeFloatConstant(1.0));
    Id zero = (bitCount == 64 ? makeDoubleConstant(0.0) : makeFloatConstant(0.0));
    for (int col = 0; col < 4; ++col) {
        for (int row = 0; row < 4; ++row) {
            if (col == row)
                ids[col][row] = one;
            else
                ids[col][row] = zero;
        }
    }

    // modify components as dictated by the arguments
    if (sources.size() == 1 && isScalar(sources[0])) {
        // a single scalar; resets the diagonals
        for (int col = 0; col < 4; ++col)
            ids[col][col] = sources[0];
    } else if (isMatrix(sources[0])) {
        // constructing from another matrix; copy over the parts that exist in both the argument and constructee
        Id matrix = sources[0];
        unsigned int minCols = std::min(numCols, getNumColumns(matrix));
        unsigned int minRows = std::min(numRows, getNumRows(matrix));
        for (unsigned int col = 0; col < minCols; ++col) {
            std::vector<unsigned> indexes;
            indexes.push_back(col);
            for (unsigned int row = 0; row < minRows; ++row) {
                indexes.push_back(row);
                ids[col][row] = createCompositeExtract(matrix, componentTypeId, indexes);
                indexes.pop_back();
                setPrecision(ids[col][row], precision);
            }
        }
    } else {
        // fill in the matrix in column-major order with whatever argument components are available
        unsigned int row = 0;
        unsigned int col = 0;

        for (unsigned int arg = 0; arg < sources.size() && col < numCols; ++arg) {
            Id argComp = sources[arg];
            for (unsigned int comp = 0; comp < getNumComponents(sources[arg]); ++comp) {
                if (getNumComponents(sources[arg]) > 1) {
                    argComp = createCompositeExtract(sources[arg], componentTypeId, comp);
                    setPrecision(argComp, precision);
                }
                ids[col][row++] = argComp;
                if (row == numRows) {
                    row = 0;
                    col++;
                }
                if (col == numCols) {
                    // If more components are provided than fit the matrix, discard the rest.
                    break;
                }
            }
        }
    }

    // Step 2:  Construct a matrix from that array.
    // First make the column vectors, then make the matrix.

    // make the column vectors
    Id columnTypeId = getContainedTypeId(resultTypeId);
    std::vector<Id> matrixColumns;
    for (unsigned int col = 0; col < numCols; ++col) {
        std::vector<Id> vectorComponents;
        for (unsigned int row = 0; row < numRows; ++row)
            vectorComponents.push_back(ids[col][row]);
        Id column = createCompositeConstruct(columnTypeId, vectorComponents);
        setPrecision(column, precision);
        matrixColumns.push_back(column);
    }

    // make the matrix
    return setPrecision(createCompositeConstruct(resultTypeId, matrixColumns), precision);
}